

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmuuidgen.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  FILE *__stream;
  undefined8 uVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  ui32_t i;
  long lVar5;
  CommandOptions Options;
  UUID UUID;
  char uuid_buf [40];
  CommandOptions local_6e;
  UUID local_68;
  char local_48 [40];
  
  CommandOptions::CommandOptions(&local_6e,argc,argv);
  __stream = _stdout;
  pcVar2 = PROGRAM_NAME;
  if (local_6e.version_flag == true) {
    uVar1 = Kumu::Version();
    fprintf(__stream,
            "\n%s (asdcplib %s)\n\nCopyright (c) 2003-2009 John Hurst\n\n%s is part of the asdcp DCP tools package.\nasdcplib may be copied only under the terms of the license found at\nthe top of every file in the asdcplib distribution kit.\n\nSpecify the -h (help) option for further information about %s\n\n"
            ,pcVar2,uVar1,PROGRAM_NAME,PROGRAM_NAME);
  }
  if (local_6e.help_flag == true) {
    fprintf(_stdout,
            "USAGE: %s [-c] [-n] [-v]\n\n       %s [-h|-help] [-V]\n\n  -c          - Output a C-language struct containing the value\n  -h | -help  - Show help\n  -n          - Suppress the newline\n  -v          - Verbose. Prints informative messages to stderr\n  -V          - Show version information\n\n  NOTES: o There is no option grouping, all options must be distinct arguments.\n         o All option arguments must be separated from the option by whitespace.\n\n"
            ,PROGRAM_NAME);
  }
  iVar3 = 0;
  iVar4 = 0;
  if ((local_6e.version_flag == false) && (iVar4 = iVar3, local_6e.help_flag == false)) {
    if (local_6e.error_flag == true) {
      main_cold_1();
      iVar4 = 3;
    }
    else {
      local_68.super_Identifier<16U>.m_HasValue = false;
      local_68.super_Identifier<16U>.m_Value[0] = '\0';
      local_68.super_Identifier<16U>.m_Value[1] = '\0';
      local_68.super_Identifier<16U>.m_Value[2] = '\0';
      local_68.super_Identifier<16U>.m_Value[3] = '\0';
      local_68.super_Identifier<16U>.m_Value[4] = '\0';
      local_68.super_Identifier<16U>.m_Value[5] = '\0';
      local_68.super_Identifier<16U>.m_Value[6] = '\0';
      local_68.super_Identifier<16U>.m_Value[7] = '\0';
      local_68.super_Identifier<16U>.m_Value[8] = '\0';
      local_68.super_Identifier<16U>.m_Value[9] = '\0';
      local_68.super_Identifier<16U>.m_Value[10] = '\0';
      local_68.super_Identifier<16U>.m_Value[0xb] = '\0';
      local_68.super_Identifier<16U>.m_Value[0xc] = '\0';
      local_68.super_Identifier<16U>.m_Value[0xd] = '\0';
      local_68.super_Identifier<16U>.m_Value[0xe] = '\0';
      local_68.super_Identifier<16U>.m_Value[0xf] = '\0';
      local_68.super_Identifier<16U>.super_IArchive._vptr_IArchive =
           (_func_int **)&PTR__IArchive_00107d10;
      Kumu::GenRandomValue(&local_68);
      pcVar2 = (char *)Kumu::bin2UUIDhex(local_68.super_Identifier<16U>.m_Value,0x10,local_48,0x28);
      if (local_6e.c_array_flag == true) {
        printf("byte_t uuid_buf[16] = {\n  // %s\n ",pcVar2);
        lVar5 = 0;
        do {
          printf(" 0x%02x,",(ulong)local_68.super_Identifier<16U>.m_Value[lVar5]);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x10);
        putchar(10);
        puts("};");
      }
      else {
        fputs(pcVar2,_stdout);
        if (local_6e.no_newline_flag == false) {
          putchar(10);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int
main(int argc, const char** argv)
{
  CommandOptions Options(argc, argv);

   if ( Options.version_flag )
    banner();

  if ( Options.help_flag )
    usage();

  if ( Options.version_flag || Options.help_flag )
    return 0;

  if ( Options.error_flag )
    {
      fprintf(stderr, "There was a problem. Type %s -h for help.\n", PROGRAM_NAME);
      return 3;
    }

  Kumu::UUID UUID;
  Kumu::GenRandomValue(UUID);
  char uuid_buf[40];

  if ( Options.c_array_flag )
    {
      const byte_t* p = UUID.Value();

      printf("\
byte_t uuid_buf[16] = {\n\
  // %s\n ",
	     UUID.EncodeHex(uuid_buf, 40));
	  
      for ( ui32_t i = 0; i < 16; i++ )
	printf(" 0x%02x,", p[i]);

      printf("\n");
      printf("};\n");
      return 0;
    }
  else
    {
      fputs(UUID.EncodeHex(uuid_buf, 40), stdout);
    }

  if ( Options.no_newline_flag == 0 )
    printf("\n");

  return 0;
}